

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O0

int ndn_hmac_sign(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
                 uint32_t output_max_size,ndn_hmac_key_t *hmac_key,uint32_t *output_used_size)

{
  int ret_val;
  uint32_t *output_used_size_local;
  ndn_hmac_key_t *hmac_key_local;
  uint32_t output_max_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (output_max_size < 0x20) {
    input_value_local._4_4_ = -10;
  }
  else {
    input_value_local._4_4_ = ndn_hmac_sha256(input_value,input_size,hmac_key,output_value);
    if (input_value_local._4_4_ == 0) {
      *output_used_size = 0x20;
      input_value_local._4_4_ = 0;
    }
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_hmac_sign(const uint8_t* input_value, uint32_t input_size,
              uint8_t* output_value, uint32_t output_max_size,
              const ndn_hmac_key_t* hmac_key,
              uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_SHA256_HASH_SIZE)
    return NDN_OVERSIZE;
  int ret_val = ndn_hmac_sha256(input_value, input_size, hmac_key, output_value);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }
  *output_used_size = NDN_SEC_SHA256_HASH_SIZE;
  return NDN_SUCCESS;
}